

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_22::ValidateReturnValue(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  uint32_t uVar2;
  Op OVar3;
  AddressingModel AVar4;
  uint32_t uVar5;
  DiagnosticStream *pDVar6;
  Feature *pFVar7;
  spv_const_validator_options psVar8;
  string local_828;
  DiagnosticStream local_808;
  Instruction *local_630;
  Instruction *return_type;
  Function *function;
  DiagnosticStream local_600;
  string local_428;
  DiagnosticStream local_408;
  Instruction *local_230;
  Instruction *value_type;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *value;
  Instruction *pIStack_20;
  uint value_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  value._4_4_ = val::Instruction::GetOperandAs<unsigned_int>(inst,0);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,value._4_4_);
  if ((local_30 == (Instruction *)0x0) ||
     (uVar2 = val::Instruction::type_id(local_30), pIVar1 = inst_local, uVar2 == 0)) {
    ValidationState_t::diag
              (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
    pDVar6 = DiagnosticStream::operator<<(&local_208,(char (*) [26])"OpReturnValue Value <id> ");
    ValidationState_t::getIdName_abi_cxx11_
              ((string *)&value_type,(ValidationState_t *)inst_local,value._4_4_);
    pDVar6 = DiagnosticStream::operator<<
                       (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &value_type);
    pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [29])" does not represent a value.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
    std::__cxx11::string::~string((string *)&value_type);
    DiagnosticStream::~DiagnosticStream(&local_208);
    return __local._4_4_;
  }
  uVar2 = val::Instruction::type_id(local_30);
  local_230 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar2);
  if ((local_230 != (Instruction *)0x0) &&
     (OVar3 = val::Instruction::opcode(local_230), OVar3 != OpTypeVoid)) {
    AVar4 = ValidationState_t::addressing_model((ValidationState_t *)inst_local);
    if ((AVar4 == AddressingModelLogical) &&
       ((((OVar3 = val::Instruction::opcode(local_230), OVar3 == OpTypePointer ||
          (OVar3 = val::Instruction::opcode(local_230), OVar3 == OpTypeUntypedPointerKHR)) &&
         (pFVar7 = ValidationState_t::features((ValidationState_t *)inst_local),
         (pFVar7->variable_pointers & 1U) == 0)) &&
        (psVar8 = ValidationState_t::options((ValidationState_t *)inst_local),
        (psVar8->relax_logical_pointer & 1U) == 0)))) {
      ValidationState_t::diag
                (&local_600,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar6 = DiagnosticStream::operator<<
                         (&local_600,(char (*) [33])"OpReturnValue value\'s type <id> ");
      pIVar1 = inst_local;
      uVar2 = val::Instruction::type_id(local_30);
      ValidationState_t::getIdName_abi_cxx11_((string *)&function,(ValidationState_t *)pIVar1,uVar2)
      ;
      pDVar6 = DiagnosticStream::operator<<
                         (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&function);
      pDVar6 = DiagnosticStream::operator<<
                         (pDVar6,(char (*) [65])
                                 " is a pointer, which is invalid in the Logical addressing model.")
      ;
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      std::__cxx11::string::~string((string *)&function);
      DiagnosticStream::~DiagnosticStream(&local_600);
      return __local._4_4_;
    }
    return_type = (Instruction *)val::Instruction::function(pIStack_20);
    pIVar1 = inst_local;
    uVar2 = val::Function::GetResultTypeId((Function *)return_type);
    local_630 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar2);
    if (local_630 != (Instruction *)0x0) {
      uVar2 = val::Instruction::id(local_630);
      uVar5 = val::Instruction::id(local_230);
      if (uVar2 == uVar5) {
        return SPV_SUCCESS;
      }
    }
    ValidationState_t::diag
              (&local_808,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
    pDVar6 = DiagnosticStream::operator<<(&local_808,(char (*) [26])"OpReturnValue Value <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&local_828,(ValidationState_t *)inst_local,value._4_4_);
    pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_828);
    pDVar6 = DiagnosticStream::operator<<
                       (pDVar6,(char (*) [48])"s type does not match OpFunction\'s return type.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
    std::__cxx11::string::~string((string *)&local_828);
    DiagnosticStream::~DiagnosticStream(&local_808);
    return __local._4_4_;
  }
  ValidationState_t::diag
            (&local_408,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
  pDVar6 = DiagnosticStream::operator<<
                     (&local_408,(char (*) [33])"OpReturnValue value\'s type <id> ");
  pIVar1 = inst_local;
  uVar2 = val::Instruction::type_id(local_30);
  ValidationState_t::getIdName_abi_cxx11_(&local_428,(ValidationState_t *)pIVar1,uVar2);
  pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_428);
  pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [21])" is missing or void.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
  std::__cxx11::string::~string((string *)&local_428);
  DiagnosticStream::~DiagnosticStream(&local_408);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateReturnValue(ValidationState_t& _,
                                 const Instruction* inst) {
  const auto value_id = inst->GetOperandAs<uint32_t>(0);
  const auto value = _.FindDef(value_id);
  if (!value || !value->type_id()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpReturnValue Value <id> " << _.getIdName(value_id)
           << " does not represent a value.";
  }
  auto value_type = _.FindDef(value->type_id());
  if (!value_type || spv::Op::OpTypeVoid == value_type->opcode()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpReturnValue value's type <id> "
           << _.getIdName(value->type_id()) << " is missing or void.";
  }

  if (_.addressing_model() == spv::AddressingModel::Logical &&
      (spv::Op::OpTypePointer == value_type->opcode() ||
       spv::Op::OpTypeUntypedPointerKHR == value_type->opcode()) &&
      !_.features().variable_pointers && !_.options()->relax_logical_pointer) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpReturnValue value's type <id> "
           << _.getIdName(value->type_id())
           << " is a pointer, which is invalid in the Logical addressing "
              "model.";
  }

  const auto function = inst->function();
  const auto return_type = _.FindDef(function->GetResultTypeId());
  if (!return_type || return_type->id() != value_type->id()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpReturnValue Value <id> " << _.getIdName(value_id)
           << "s type does not match OpFunction's return type.";
  }

  return SPV_SUCCESS;
}